

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined2 *puVar12;
  uint uVar13;
  undefined2 *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  int iVar4;
  
  iVar11 = 1 << ((byte)tableLog & 0x1f);
  uVar15 = tableLog - 5;
  puVar14 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar9 = 4;
  bVar18 = false;
  uVar17 = 0;
  puVar12 = (undefined2 *)header;
  uVar2 = iVar11 + 1;
  iVar10 = tableLog + 1;
  while( true ) {
    if (bVar18) {
      uVar7 = (ulong)(uVar17 - 1);
      do {
        iVar4 = (int)uVar7;
        uVar3 = iVar4 + 1;
        uVar7 = (ulong)uVar3;
      } while (normalizedCounter[uVar7] == 0);
      if (uVar17 + 0x18 <= uVar3) {
        uVar16 = uVar17;
        do {
          if ((writeIsSafe == 0) && (puVar14 < puVar12)) {
            return 0xffffffffffffffba;
          }
          uVar15 = uVar15 + (0xffff << ((byte)iVar9 & 0x1f));
          *puVar12 = (short)uVar15;
          puVar12 = puVar12 + 1;
          uVar15 = uVar15 >> 0x10;
          uVar17 = uVar16 + 0x18;
          uVar13 = uVar16 + 0x30;
          uVar16 = uVar17;
        } while (uVar13 <= uVar3);
      }
      uVar13 = uVar17 + 3;
      uVar16 = uVar17;
      while (uVar13 <= uVar3) {
        uVar15 = uVar15 + (3 << ((byte)iVar9 & 0x1f));
        iVar9 = iVar9 + 2;
        uVar13 = uVar16 + 6;
        uVar16 = uVar16 + 3;
      }
      uVar17 = iVar4 + 2;
      uVar15 = (uVar3 - uVar16 << ((byte)iVar9 & 0x1f)) + uVar15;
      if (iVar9 < 0xf) {
        iVar9 = iVar9 + 2;
      }
      else {
        if ((writeIsSafe == 0) && (puVar14 < puVar12)) {
          return 0xffffffffffffffba;
        }
        *puVar12 = (short)uVar15;
        puVar12 = puVar12 + 1;
        uVar15 = uVar15 >> 0x10;
        iVar9 = iVar9 + -0xe;
      }
    }
    else {
      uVar7 = (ulong)uVar17;
      uVar17 = uVar17 + 1;
    }
    iVar5 = (int)normalizedCounter[uVar7];
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar1 = ~uVar2 + iVar11 * 2;
    iVar6 = iVar1;
    if (iVar5 + 1 < iVar11) {
      iVar6 = 0;
    }
    iVar6 = iVar5 + iVar6 + 1;
    bVar18 = iVar6 == 1;
    uVar3 = uVar2 - iVar4;
    iVar5 = iVar10;
    if (uVar3 == 0 || (int)uVar2 < iVar4) break;
    for (; (int)uVar3 < iVar11; iVar11 = iVar11 >> 1) {
      iVar5 = iVar5 + -1;
    }
    uVar15 = uVar15 + (iVar6 << ((byte)iVar9 & 0x1f));
    iVar9 = (iVar9 + iVar10) - (uint)(iVar6 < iVar1);
    if (0x10 < iVar9) {
      if ((writeIsSafe == 0) && (puVar14 < puVar12)) {
        return 0xffffffffffffffba;
      }
      *puVar12 = (short)uVar15;
      puVar12 = puVar12 + 1;
      uVar15 = uVar15 >> 0x10;
      iVar9 = iVar9 + -0x10;
    }
    uVar2 = uVar3;
    iVar10 = iVar5;
    if (uVar3 == 1) {
      if ((writeIsSafe != 0) || (sVar8 = 0xffffffffffffffba, puVar12 <= puVar14)) {
        *puVar12 = (short)uVar15;
        sVar8 = 0xffffffffffffffff;
        if (uVar17 <= maxSymbolValue + 1) {
          iVar10 = iVar9 + 0xe;
          if (-1 < iVar9 + 7) {
            iVar10 = iVar9 + 7;
          }
          sVar8 = (long)puVar12 + ((long)(iVar10 >> 3) - (long)header);
        }
      }
      return sVar8;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                                       const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                                       unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    bitStream = 0;
    bitCount  = 0;
    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while (remaining>1) {  /* stops at 1 */
        if (previous0) {
            unsigned start = charnum;
            while (!normalizedCounter[charnum]) charnum++;
            while (charnum >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (charnum >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (charnum-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[charnum++];
            int const max = (2*threshold-1)-remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold) count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previous0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    if (charnum > maxSymbolValue + 1) return ERROR(GENERIC);

    return (out-ostart);
}